

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6240a::TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat::RunImpl
          (TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat *this)

{
  TestDetails *details;
  XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper fixtureHelper;
  undefined1 auStack_1d8 [376];
  TestReporter local_60;
  vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_> local_58;
  TestDetails *local_38;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture((XmlTestReporterFixture *)auStack_1d8);
  local_38 = details;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper>
            ((XmlTestReporterFixtureSingleFailedTestReportSummaryFormatHelper *)auStack_1d8,details)
  ;
  local_60._vptr_TestReporter = (_func_int **)&PTR__DeferredTestReporter_00152c28;
  std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::~vector
            (&local_58);
  UnitTest::TestReporter::~TestReporter(&local_60);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1d8);
  std::ios_base::~ios_base((ios_base *)(auStack_1d8 + 0x70));
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleFailedTestReportSummaryFormat)
{
    TestDetails const details("A Test", "suite", "A File", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "A Failure");
    reporter.ReportSummary(1, 1, 1, 0.1f);

    const char *expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"A Test\" time=\"0\">"
        "<failure message=\"A File(4321) : A Failure\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}